

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL12_compat.c
# Opt level: O3

int SDL_CDPlayTracks(SDL12_CD *cdrom,int start_track,int start_frame,int ntracks,int nframes)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  
  if (CDRomInit == '\x01') {
    if ((cdrom != (SDL12_CD *)0x0) || (cdrom = CDRomDevice, CDRomDevice != (SDL12_CD *)0x0)) {
      if (cdrom->status == SDL12_CD_TRAYEMPTY) {
        pcVar3 = "Tray empty";
      }
      else {
        if (-1 < start_track) {
          uVar1 = cdrom->numtracks;
          if (uVar1 - start_track != 0 && start_track <= (int)uVar1) {
            if ((start_frame < 0) || (cdrom->track[(uint)start_track].length <= (uint)start_frame))
            {
              pcVar3 = "Invalid start frame";
            }
            else if ((ntracks < 0) || (uVar1 <= (uint)(ntracks + start_track))) {
              pcVar3 = "Invalid number of tracks";
            }
            else {
              if ((-1 < nframes) &&
                 ((uint)nframes < cdrom->track[(uint)(ntracks + start_track)].length)) {
                if (nframes == 0 && ntracks == 0) {
                  nframes = cdrom->track[uVar1 - 1].length;
                  ntracks = uVar1 - start_track;
                }
                iVar2 = StartCDAudioPlaying(cdrom,start_track,start_frame,ntracks,nframes);
                return iVar2;
              }
              pcVar3 = "Invalid number of frames";
            }
            goto LAB_00112b95;
          }
        }
        pcVar3 = "Invalid start track";
      }
LAB_00112b95:
      iVar2 = (*SDL20_SetError)(pcVar3,start_track,start_frame,SDL20_SetError);
      return iVar2;
    }
    pcVar3 = "CD-ROM not opened";
  }
  else {
    pcVar3 = "CD-ROM subsystem not initialized";
  }
  (*SDL20_SetError)(pcVar3);
  return -1;
}

Assistant:

SDLCALL
SDL_CDPlayTracks(SDL12_CD *cdrom, int start_track, int start_frame, int ntracks, int nframes)
{
    if ((cdrom = ValidCDDevice(cdrom)) == NULL) {
        return -1;
    }
    if (cdrom->status == SDL12_CD_TRAYEMPTY) {
        return SDL20_SetError("Tray empty");
    }
    if ((start_track < 0) || (start_track >= cdrom->numtracks)) {
        return SDL20_SetError("Invalid start track");
    }
    if ((start_frame < 0) || (((Uint32) start_frame) >= cdrom->track[start_track].length)) {
        return SDL20_SetError("Invalid start frame");
    }
    if ((ntracks < 0) || ((start_track + ntracks) >= cdrom->numtracks)) {
        return SDL20_SetError("Invalid number of tracks");
    }
    if ((nframes < 0) || (((Uint32) nframes) >= cdrom->track[start_track + ntracks].length)) {
        return SDL20_SetError("Invalid number of frames");
    }

    if (!ntracks && !nframes) {
        ntracks = cdrom->numtracks - start_track;
        nframes = cdrom->track[cdrom->numtracks - 1].length;
    }

    return StartCDAudioPlaying(cdrom, start_track, start_frame, ntracks, nframes);
}